

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.cpp
# Opt level: O0

void util::binary_string::load(istream *is,string *target)

{
  ulong uVar1;
  uint *puVar2;
  char *in_RSI;
  char *in_RDI;
  uint32_t buf_size;
  char buffer [10240];
  uint32_t length;
  uint local_2820;
  uint local_281c;
  undefined1 local_2818 [10244];
  uint local_14;
  char *local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_14 = load<unsigned_int>((istream *)0x1c19e4);
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::clear();
    for (; local_14 != 0; local_14 = local_14 - local_281c) {
      local_2820 = 0x2800;
      puVar2 = std::min<unsigned_int>(&local_14,&local_2820);
      local_281c = *puVar2;
      std::istream::read(local_8,(long)local_2818);
      std::__cxx11::string::append(local_10,(ulong)local_2818);
    }
  }
  return;
}

Assistant:

void binary_string::load(std::istream & is, std::string & target) {
	
	boost::uint32_t length = util::load<boost::uint32_t>(is);
	if(is.fail()) {
		return;
	}
	
	target.clear();
	
	while(length) {
		char buffer[10 * 1024];
		boost::uint32_t buf_size = std::min(length, boost::uint32_t(sizeof(buffer)));
		is.read(buffer, std::streamsize(buf_size));
		target.append(buffer, buf_size);
		length -= buf_size;
	}
}